

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::OneHotLayerParams::MergeFrom(OneHotLayerParams *this,OneHotLayerParams *from)

{
  LogMessage *other;
  uint64_t uVar1;
  int64_t iVar2;
  float fVar3;
  uint32_t raw_offvalue;
  float tmp_offvalue;
  uint32_t raw_onvalue;
  float tmp_onvalue;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  OneHotLayerParams *local_18;
  OneHotLayerParams *from_local;
  OneHotLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe336);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=
              ((LogFinisher *)((long)&tmp_onvalue + 3),other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar1 = _internal_onehotvectorsize(local_18);
  if (uVar1 != 0) {
    uVar1 = _internal_onehotvectorsize(local_18);
    _internal_set_onehotvectorsize(this,uVar1);
  }
  iVar2 = _internal_axis(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_axis(local_18);
    _internal_set_axis(this,iVar2);
  }
  fVar3 = _internal_onvalue(local_18);
  if (fVar3 != 0.0) {
    fVar3 = _internal_onvalue(local_18);
    _internal_set_onvalue(this,fVar3);
  }
  fVar3 = _internal_offvalue(local_18);
  if (fVar3 != 0.0) {
    fVar3 = _internal_offvalue(local_18);
    _internal_set_offvalue(this,fVar3);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void OneHotLayerParams::MergeFrom(const OneHotLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.OneHotLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_onehotvectorsize() != 0) {
    _internal_set_onehotvectorsize(from._internal_onehotvectorsize());
  }
  if (from._internal_axis() != 0) {
    _internal_set_axis(from._internal_axis());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_onvalue = from._internal_onvalue();
  uint32_t raw_onvalue;
  memcpy(&raw_onvalue, &tmp_onvalue, sizeof(tmp_onvalue));
  if (raw_onvalue != 0) {
    _internal_set_onvalue(from._internal_onvalue());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_offvalue = from._internal_offvalue();
  uint32_t raw_offvalue;
  memcpy(&raw_offvalue, &tmp_offvalue, sizeof(tmp_offvalue));
  if (raw_offvalue != 0) {
    _internal_set_offvalue(from._internal_offvalue());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}